

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O0

void __thiscall deqp::egl::MakeCurrentPerfCase::logResults(MakeCurrentPerfCase *this)

{
  value_type vVar1;
  TestContext *this_00;
  int iVar2;
  float fVar3;
  TestLog *pTVar4;
  size_type sVar5;
  reference pvVar6;
  SampleBuilder *this_01;
  float *pfVar7;
  MessageBuilder *pMVar8;
  char *description;
  int precision;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float local_db8;
  float local_dac;
  string local_d08;
  MessageBuilder local_ce8;
  MessageBuilder local_b68;
  MessageBuilder local_9e8;
  MessageBuilder local_868;
  MessageBuilder local_6e8;
  MessageBuilder local_568;
  MessageBuilder local_3e8;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  ScopedLogSection local_218;
  ScopedLogSection section;
  int local_208;
  float iterationTimeUs_2;
  int sampleNdx_4;
  float iterationTimeUs_1;
  int sampleNdx_3;
  float iterationTimeUs;
  int sampleNdx_2;
  int sampleNdx_1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1e8;
  float local_1e0;
  float local_1dc;
  float iterationTimeMaxUs;
  float iterationTimeMinUs;
  float iterationTimeSkewnessUs;
  float iterationTimeVarianceUs;
  float iterationTimeMedianUs;
  float iterationTimeMeanUs;
  deUint64 totalIterationCount;
  deUint64 totalTimeUs;
  int local_198;
  allocator<char> local_191;
  int sampleNdx;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  LogValueInfo local_120;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_79;
  string local_78;
  LogSampleList local_58;
  TestLog *local_18;
  TestLog *log;
  MakeCurrentPerfCase *this_local;
  
  log = (TestLog *)this;
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  local_18 = pTVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Result",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"Result",&local_b1);
  tcu::LogSampleList::LogSampleList(&local_58,&local_78,&local_b0);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_58);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,(SampleInfoToken *)&tcu::TestLog::SampleInfo);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"Time",&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"Time",&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&sampleNdx,"us",&local_191);
  tcu::LogValueInfo::LogValueInfo
            (&local_120,&local_140,&local_168,(string *)&sampleNdx,QP_SAMPLE_VALUE_TAG_RESPONSE);
  pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_120);
  tcu::TestLog::operator<<(pTVar4,(EndSampleInfoToken *)&tcu::TestLog::EndSampleInfo);
  tcu::LogValueInfo::~LogValueInfo(&local_120);
  std::__cxx11::string::~string((string *)&sampleNdx);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  tcu::LogSampleList::~LogSampleList(&local_58);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  for (local_198 = 0; iVar2 = local_198,
      sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_samples),
      iVar2 < (int)sVar5; local_198 = local_198 + 1) {
    tcu::TestLog::operator<<
              ((SampleBuilder *)&totalTimeUs,local_18,(BeginSampleToken *)&tcu::TestLog::Sample);
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_samples,(long)local_198);
    this_01 = tcu::SampleBuilder::operator<<((SampleBuilder *)&totalTimeUs,*pvVar6);
    tcu::SampleBuilder::operator<<(this_01,(EndSampleToken *)&tcu::TestLog::EndSample);
    tcu::SampleBuilder::~SampleBuilder((SampleBuilder *)&totalTimeUs);
  }
  tcu::TestLog::operator<<(local_18,(EndSampleListToken *)&tcu::TestLog::EndSampleList);
  totalIterationCount = 0;
  _iterationTimeMedianUs = 0;
  iterationTimeVarianceUs = 0.0;
  iterationTimeSkewnessUs = 0.0;
  iterationTimeMinUs = 0.0;
  iterationTimeMaxUs = 0.0;
  local_1dc = std::numeric_limits<float>::max();
  local_1e0 = 0.0;
  local_1e8._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->m_samples);
  _sampleNdx_2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->m_samples);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (local_1e8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )_sampleNdx_2);
  for (iterationTimeUs = 0.0; fVar3 = iterationTimeUs,
      sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_samples),
      (int)fVar3 < (int)sVar5; iterationTimeUs = (float)((int)iterationTimeUs + 1)) {
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_samples,(long)(int)iterationTimeUs);
    totalIterationCount = *pvVar6 + totalIterationCount;
    _iterationTimeMedianUs = (this->m_spec).iterationCount + _iterationTimeMedianUs;
  }
  auVar10._8_4_ = (int)(totalIterationCount >> 0x20);
  auVar10._0_8_ = totalIterationCount;
  auVar10._12_4_ = 0x45300000;
  auVar16._8_4_ = (int)((ulong)_iterationTimeMedianUs >> 0x20);
  auVar16._0_8_ = _iterationTimeMedianUs;
  auVar16._12_4_ = 0x45300000;
  iterationTimeVarianceUs =
       (float)(((auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)totalIterationCount) - 4503599627370496.0)) /
              ((auVar16._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)_iterationTimeMedianUs) - 4503599627370496.0)));
  sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_samples);
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->m_samples,sVar5 >> 1);
  vVar1 = *pvVar6;
  auVar11._8_4_ = (int)(vVar1 >> 0x20);
  auVar11._0_8_ = vVar1;
  auVar11._12_4_ = 0x45300000;
  iterationTimeSkewnessUs =
       (float)(((auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)vVar1) - 4503599627370496.0)) /
              (double)(this->m_spec).iterationCount);
  for (sampleNdx_3 = 0; iVar2 = sampleNdx_3,
      sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_samples),
      iVar2 < (int)sVar5; sampleNdx_3 = sampleNdx_3 + 1) {
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_samples,(long)sampleNdx_3);
    vVar1 = *pvVar6;
    auVar12._8_4_ = (int)(vVar1 >> 0x20);
    auVar12._0_8_ = vVar1;
    auVar12._12_4_ = 0x45300000;
    iterationTimeUs_1 =
         (float)(((auVar12._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)vVar1) - 4503599627370496.0)) /
                (double)(this->m_spec).iterationCount);
    dVar9 = std::pow((double)(ulong)(uint)(iterationTimeUs_1 - iterationTimeSkewnessUs),
                     5.30498947741318e-315);
    iterationTimeMinUs = SUB84(dVar9,0) + iterationTimeMinUs;
  }
  for (sampleNdx_4 = 0; iVar2 = sampleNdx_4,
      sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_samples),
      iVar2 < (int)sVar5; sampleNdx_4 = sampleNdx_4 + 1) {
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_samples,(long)sampleNdx_4);
    vVar1 = *pvVar6;
    auVar13._8_4_ = (int)(vVar1 >> 0x20);
    auVar13._0_8_ = vVar1;
    auVar13._12_4_ = 0x45300000;
    iterationTimeUs_2 =
         (float)(((auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)vVar1) - 4503599627370496.0)) /
                (double)(this->m_spec).iterationCount);
    pfVar7 = std::min<float>(&local_1dc,&iterationTimeUs_2);
    local_1dc = *pfVar7;
    pfVar7 = std::max<float>(&local_1e0,&iterationTimeUs_2);
    local_1e0 = *pfVar7;
  }
  sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_samples);
  local_dac = (float)sVar5;
  iterationTimeMinUs = iterationTimeMinUs / local_dac;
  for (local_208 = 0;
      sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_samples),
      local_208 < (int)sVar5; local_208 = local_208 + 1) {
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_samples,(long)local_208);
    vVar1 = *pvVar6;
    auVar14._8_4_ = (int)(vVar1 >> 0x20);
    auVar14._0_8_ = vVar1;
    auVar14._12_4_ = 0x45300000;
    section.m_log._4_4_ =
         (float)(((auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)vVar1) - 4503599627370496.0)) /
                (double)(this->m_spec).iterationCount);
    dVar9 = std::pow((double)(ulong)(uint)((section.m_log._4_4_ - iterationTimeSkewnessUs) /
                                          iterationTimeMinUs),5.30498947741318e-315);
    iterationTimeMaxUs = SUB84(dVar9,0);
  }
  sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_samples);
  pTVar4 = local_18;
  local_db8 = (float)sVar5;
  iterationTimeMaxUs = iterationTimeMaxUs / local_db8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"Result",&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"Statistics from results.",&local_261);
  tcu::ScopedLogSection::ScopedLogSection(&local_218,pTVar4,&local_238,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  tcu::TestLog::operator<<(&local_3e8,local_18,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_3e8,(char (*) [13])"Total time: ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&totalIterationCount);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x599e5c);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_3e8);
  tcu::TestLog::operator<<(&local_568,local_18,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_568,(char (*) [7])"Mean: ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&iterationTimeVarianceUs);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x599e5c);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_568);
  tcu::TestLog::operator<<(&local_6e8,local_18,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_6e8,(char (*) [9])"Median: ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&iterationTimeSkewnessUs);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x599e5c);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_6e8);
  tcu::TestLog::operator<<(&local_868,local_18,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_868,(char (*) [11])"Variance: ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&iterationTimeMinUs);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x599e5c);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_868);
  tcu::TestLog::operator<<(&local_9e8,local_18,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_9e8,(char (*) [11])"Skewness: ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&iterationTimeMaxUs);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x599e5c);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_9e8);
  tcu::TestLog::operator<<(&local_b68,local_18,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_b68,(char (*) [6])"Min: ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_1dc);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x599e5c);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_b68);
  tcu::TestLog::operator<<(&local_ce8,local_18,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_ce8,(char (*) [6])"Max: ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_1e0);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x599e5c);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_ce8);
  tcu::ScopedLogSection::~ScopedLogSection(&local_218);
  this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  auVar15._8_4_ = (int)(totalIterationCount >> 0x20);
  auVar15._0_8_ = totalIterationCount;
  auVar15._12_4_ = 0x45300000;
  auVar17._8_4_ = (int)((ulong)_iterationTimeMedianUs >> 0x20);
  auVar17._0_8_ = _iterationTimeMedianUs;
  auVar17._12_4_ = 0x45300000;
  de::floatToString_abi_cxx11_
            (&local_d08,(de *)0x2,
             (float)(((auVar15._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)totalIterationCount) - 4503599627370496.0)) /
                    ((auVar17._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)_iterationTimeMedianUs) - 4503599627370496.0))
                    ),precision);
  description = (char *)std::__cxx11::string::c_str();
  tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,description);
  std::__cxx11::string::~string((string *)&local_d08);
  return;
}

Assistant:

void MakeCurrentPerfCase::logResults (void)
{
	TestLog& log = m_testCtx.getLog();

	log << TestLog::SampleList("Result", "Result")
		<< TestLog::SampleInfo << TestLog::ValueInfo("Time", "Time", "us", QP_SAMPLE_VALUE_TAG_RESPONSE)
		<< TestLog::EndSampleInfo;

	for (int sampleNdx = 0; sampleNdx < (int)m_samples.size(); sampleNdx++)
		log << TestLog::Sample << deInt64(m_samples[sampleNdx]) << TestLog::EndSample;

	log << TestLog::EndSampleList;

	// Log stats
	{
		deUint64	totalTimeUs				= 0;
		deUint64	totalIterationCount		= 0;

		float		iterationTimeMeanUs		= 0.0f;
		float		iterationTimeMedianUs	= 0.0f;
		float		iterationTimeVarianceUs	= 0.0f;
		float		iterationTimeSkewnessUs	= 0.0f;
		float		iterationTimeMinUs		= std::numeric_limits<float>::max();
		float		iterationTimeMaxUs		= 0.0f;

		std::sort(m_samples.begin(), m_samples.end());

		// Calculate totals
		for (int sampleNdx = 0; sampleNdx < (int)m_samples.size(); sampleNdx++)
		{
			totalTimeUs			+= m_samples[sampleNdx];
			totalIterationCount	+= m_spec.iterationCount;
		}

		// Calculate mean and median
		iterationTimeMeanUs		= ((float)(((double)totalTimeUs) / (double)totalIterationCount));
		iterationTimeMedianUs	= ((float)(((double)m_samples[m_samples.size() / 2]) / (double)m_spec.iterationCount));

		// Calculate variance
		for (int sampleNdx = 0; sampleNdx < (int)m_samples.size(); sampleNdx++)
		{
			float iterationTimeUs	= (float)(((double)m_samples[sampleNdx]) / m_spec.iterationCount);
			iterationTimeVarianceUs	+= std::pow(iterationTimeUs - iterationTimeMedianUs, 2.0f);
		}

		// Calculate min and max
		for (int sampleNdx = 0; sampleNdx < (int)m_samples.size(); sampleNdx++)
		{
			float iterationTimeUs	= (float)(((double)m_samples[sampleNdx]) / m_spec.iterationCount);
			iterationTimeMinUs		= std::min<float>(iterationTimeMinUs, iterationTimeUs);
			iterationTimeMaxUs		= std::max<float>(iterationTimeMaxUs, iterationTimeUs);
		}

		iterationTimeVarianceUs /= (float)m_samples.size();

		// Calculate skewness
		for (int sampleNdx = 0; sampleNdx < (int)m_samples.size(); sampleNdx++)
		{
			float iterationTimeUs	= (float)(((double)m_samples[sampleNdx]) / m_spec.iterationCount);
			iterationTimeSkewnessUs	= std::pow((iterationTimeUs - iterationTimeMedianUs) / iterationTimeVarianceUs, 2.0f);
		}

		iterationTimeSkewnessUs /= (float)m_samples.size();

		{
			tcu::ScopedLogSection	section(log, "Result", "Statistics from results.");

			log << TestLog::Message << "Total time: "	<< totalTimeUs				<< "us" << TestLog::EndMessage;
			log << TestLog::Message << "Mean: "			<< iterationTimeMeanUs		<< "us" << TestLog::EndMessage;
			log << TestLog::Message << "Median: "		<< iterationTimeMedianUs	<< "us" << TestLog::EndMessage;
			log << TestLog::Message << "Variance: "		<< iterationTimeVarianceUs	<< "us" << TestLog::EndMessage;
			log << TestLog::Message << "Skewness: "		<< iterationTimeSkewnessUs	<< "us" << TestLog::EndMessage;
			log << TestLog::Message << "Min: "			<< iterationTimeMinUs		<< "us" << TestLog::EndMessage;
			log << TestLog::Message << "Max: "			<< iterationTimeMaxUs		<< "us" << TestLog::EndMessage;
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString((float)(((double)totalTimeUs)/(double)totalIterationCount), 2).c_str());
	}
}